

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

string * trim(string *__return_storage_ptr__,string *input)

{
  char *pcVar1;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  size_type sVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 *local_48;
  pointer local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + input->_M_string_length);
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar5 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar3 + sVar5;
  pcVar7 = pcVar3;
  pcVar6 = pcVar3;
  while ((sVar5 != 0 && (iVar4 = isspace((int)*pcVar6), pcVar7 = pcVar6, iVar4 != 0))) {
    pcVar6 = pcVar6 + 1;
    sVar5 = sVar5 - 1;
    pcVar7 = pcVar1;
  }
  if (pcVar1 == pcVar7) {
    __return_storage_ptr__->_M_string_length = 0;
    *pcVar3 = '\0';
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (__return_storage_ptr__,0,(long)pcVar7 - (long)pcVar3);
  }
  local_40 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_38 = local_40 + __return_storage_ptr__->_M_string_length;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string_const&)::_lambda(char)_2_>>
            (&local_48);
  __return_storage_ptr__->_M_string_length =
       (long)local_48 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *local_48 = 0;
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim( std::string const & input )
{
  std::string result = input;
  result.erase( result.begin(), std::ranges::find_if( result, []( char c ) noexcept { return !std::isspace( c ); } ) );
  result.erase( std::find_if( result.rbegin(), result.rend(), []( char c ) noexcept { return !std::isspace( c ); } ).base(), result.end() );
  return result;
}